

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  _Base_ptr p_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  string *label;
  _Base_ptr p_Var8;
  char *local_5f8 [4];
  _Base_ptr local_5d8;
  _Base_ptr local_5d0;
  cmWorkingDirectory workdir;
  ostringstream cmCTestLog_msg_5;
  long alStack_590 [45];
  ostringstream indexStr;
  cmCTestRunTest testRun;
  
  bVar4 = cmCTest::GetOutputAsJson(this->CTest);
  if (bVar4) {
    PrintOutputAsJson(this);
    return;
  }
  pcVar1 = this->TestHandler;
  iVar5 = FindMaxIndex(this);
  pcVar1->MaxIndex = iVar5;
  local_5d8 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var7 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var7 != local_5d8) {
    p_Var2 = p_Var7[1]._M_parent;
    local_5d0 = p_Var7;
    cmWorkingDirectory::cmWorkingDirectory(&workdir,(string *)&p_Var2[2]._M_parent);
    cmCTestRunTest::cmCTestRunTest(&testRun,this,*(int *)&p_Var2[0x10]._M_parent);
    cmCTestRunTest::ComputeArguments(&testRun);
    p_Var7 = p_Var2[0x13]._M_parent;
    p_Var8 = p_Var7;
    if (p_Var7 != p_Var2[0x13]._M_left) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"Labels:");
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x57b,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      p_Var7 = p_Var2[0x13]._M_parent;
      p_Var8 = p_Var2[0x13]._M_left;
    }
    for (; p_Var7 != p_Var8; p_Var7 = p_Var7 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      poVar6 = std::operator<<((ostream *)&indexStr," ");
      std::operator<<(poVar6,(string *)p_Var7);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x57f,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    }
    if (p_Var2[0x13]._M_parent != p_Var2[0x13]._M_left) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::endl<char,std::char_traits<char>>((ostream *)&indexStr);
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x584,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    }
    if (this->TestHandler->MemCheck == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"  Memory Check");
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x589,_cmCTestLog_msg_5,this->Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"  Test");
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x58b,_cmCTestLog_msg_5,this->Quiet);
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    poVar6 = std::operator<<((ostream *)&indexStr," #");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)&p_Var2[0x10]._M_parent);
    std::operator<<(poVar6,":");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    iVar5 = getNumWidth((long)this->TestHandler->MaxIndex);
    *(long *)((long)alStack_590 + *(long *)(_cmCTestLog_msg_5 + -0x18)) = (long)(iVar5 + 3);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&cmCTestLog_msg_5,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x593,local_5f8[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_5," ");
    std::operator<<(poVar6,(string *)&p_Var2[1]._M_parent);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x595,local_5f8[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    if (*(byte *)((long)&p_Var2[0xd]._M_color + 2) == 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      std::operator<<((ostream *)&cmCTestLog_msg_5," (Disabled)");
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x598,local_5f8[0],this->Quiet);
      std::__cxx11::string::~string((string *)local_5f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg_5);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x59a,local_5f8[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    cmCTestRunTest::~cmCTestRunTest(&testRun);
    cmWorkingDirectory::~cmWorkingDirectory(&workdir);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_5d0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testRun);
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&testRun);
  poVar6 = std::operator<<(poVar6,"Total Tests: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x5a0,_indexStr,this->Quiet);
  std::__cxx11::string::~string((string *)&indexStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testRun);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this, p.Index);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}